

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

int runmcmp(runcxdef *ctx)

{
  long lVar1;
  long lVar2;
  void *p;
  void *p_00;
  undefined8 *in_RDI;
  uint len2;
  uint len1;
  uchar *str1;
  uchar *str2;
  long num1;
  long num2;
  int in_stack_ffffffffffffff9c;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  int local_38;
  int local_34;
  byte *local_30;
  byte *local_28;
  int local_4;
  
  if (*(char *)(in_RDI[4] + -0x10) == '\x01') {
    lVar1 = in_RDI[4];
    in_RDI[4] = lVar1 + -0x10;
    if (*(char *)(lVar1 + -0x10) != '\x01') {
      *(undefined4 *)(*(long *)*in_RDI + 0x68) = 0;
      runsign((runcxdef *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
              in_stack_ffffffffffffff9c);
    }
    lVar1 = *(long *)(in_RDI[4] + 8);
    lVar2 = in_RDI[4];
    in_RDI[4] = lVar2 + -0x10;
    if (*(char *)(lVar2 + -0x10) != '\x01') {
      *(undefined4 *)(*(long *)*in_RDI + 0x68) = 0;
      runsign((runcxdef *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
              in_stack_ffffffffffffff9c);
    }
    if (lVar1 < *(long *)(in_RDI[4] + 8)) {
      local_4 = 1;
    }
    else if (*(long *)(in_RDI[4] + 8) < lVar1) {
      local_4 = -1;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    if (*(char *)(in_RDI[4] + -0x10) != '\x03') {
      *(undefined4 *)(*(long *)*in_RDI + 0x68) = 0;
      runsign((runcxdef *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
              in_stack_ffffffffffffff9c);
    }
    lVar1 = in_RDI[4];
    in_RDI[4] = lVar1 + -0x10;
    if (*(char *)(lVar1 + -0x10) != '\x03') {
      *(undefined4 *)(*(long *)*in_RDI + 0x68) = 0;
      runsign((runcxdef *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
              in_stack_ffffffffffffff9c);
    }
    p = *(void **)(in_RDI[4] + 8);
    lVar1 = in_RDI[4];
    in_RDI[4] = lVar1 + -0x10;
    if (*(char *)(lVar1 + -0x10) != '\x03') {
      *(undefined4 *)(*(long *)*in_RDI + 0x68) = 0;
      runsign((runcxdef *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
              in_stack_ffffffffffffff9c);
    }
    p_00 = *(void **)(in_RDI[4] + 8);
    local_34 = osrp2(p_00);
    local_38 = osrp2(p);
    local_38 = local_38 + -2;
    local_30 = (byte *)((long)p_00 + 2);
    local_28 = (byte *)((long)p + 2);
    for (local_34 = local_34 + -2; local_34 != 0 && local_38 != 0; local_34 = local_34 + -1) {
      if (*local_30 < *local_28) {
        return -1;
      }
      if (*local_28 < *local_30) {
        return 1;
      }
      local_30 = local_30 + 1;
      local_28 = local_28 + 1;
      local_38 = local_38 + -1;
    }
    if (local_34 == 0) {
      if (local_38 == 0) {
        local_4 = 0;
      }
      else {
        local_4 = -1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int runmcmp(runcxdef *ctx)
{
    if (runtostyp(ctx) == DAT_NUMBER)
    {
        long num2 = runpopnum(ctx);
        long num1 = runpopnum(ctx);
        
        if (num1 > num2) return(1);
        else if (num1 < num2) return(-1);
        else return(0);
    }
    else if (runtostyp(ctx) == DAT_SSTRING)
    {
        uchar *str2 = runpopstr(ctx);
        uchar *str1 = runpopstr(ctx);
        uint   len1 = osrp2(str1) - 2;
        uint   len2 = osrp2(str2) - 2;
        
        str1 += 2;
        str2 += 2;
        while (len1 && len2)
        {
            if (*str1 < *str2) return(-1);   /* character from 1 is greater */
            else if (*str1 > *str2) return(1);       /* char from 1 is less */
            
            ++str1;
            ++str2;
            --len1;
            --len2;
        }
        if (len1) return(1);    /* match up to len2, but string 1 is longer */
        else if (len2) return(-1);  /* match up to len1, but str2 is longer */
        else return(0);                            /* strings are identical */
    }
    else
    {
        runsig(ctx, ERR_INVCMP);
    }
    return 0;
}